

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

SampledSpectrum __thiscall
pbrt::ImageInfiniteLight::LookupLe(ImageInfiniteLight *this,Point2f st,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined8 uVar2;
  array<float,_4> aVar3;
  Float *pFVar4;
  RGBColorSpace *in_RSI;
  RGBSpectrum *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  SampledSpectrum SVar11;
  int c;
  RGB rgb;
  SampledSpectrum *s;
  Float in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff8c;
  Image *in_stack_ffffffffffffff90;
  array<pbrt::WrapMode,_2> in_stack_ffffffffffffff98;
  Tuple2<pbrt::Point2,_float> in_stack_ffffffffffffffa0;
  SampledWavelengths *in_stack_ffffffffffffffa8;
  RGBSpectrum *in_stack_ffffffffffffffb0;
  int local_38;
  RGB *in_stack_ffffffffffffffd0;
  undefined1 auVar7 [56];
  undefined1 auVar10 [56];
  
  vmovlpd_avx(in_ZMM0._0_16_);
  RGB::RGB((RGB *)&stack0xffffffffffffffcc);
  for (local_38 = 0; auVar10 = in_ZMM1._8_56_, local_38 < 3; local_38 = local_38 + 1) {
    in_stack_ffffffffffffff74 =
         Image::LookupNearestChannel
                   (in_stack_ffffffffffffff90,(Point2f)in_stack_ffffffffffffffa0,
                    (int)in_stack_ffffffffffffff8c,(WrapMode2D)in_stack_ffffffffffffff98.values);
    pFVar4 = RGB::operator[]((RGB *)&stack0xffffffffffffffcc,local_38);
    *pFVar4 = in_stack_ffffffffffffff74;
  }
  auVar7 = (undefined1  [56])0x0;
  s = (SampledSpectrum *)&stack0xffffffffffffff80;
  RGBSpectrum::RGBSpectrum(in_RDI,in_RSI,in_stack_ffffffffffffffd0);
  SVar11 = RGBSpectrum::Sample(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  auVar8._0_8_ = SVar11.values.values._8_8_;
  auVar8._8_56_ = auVar10;
  auVar5._0_8_ = SVar11.values.values._0_8_;
  auVar5._8_56_ = auVar7;
  auVar7 = (undefined1  [56])0x0;
  vmovlpd_avx(auVar5._0_16_);
  vmovlpd_avx(auVar8._0_16_);
  SVar11 = pbrt::operator*(in_stack_ffffffffffffff74,s);
  auVar9._0_8_ = SVar11.values.values._8_8_;
  auVar9._8_56_ = auVar10;
  auVar6._0_8_ = SVar11.values.values._0_8_;
  auVar6._8_56_ = auVar7;
  uVar1 = vmovlpd_avx(auVar6._0_16_);
  uVar2 = vmovlpd_avx(auVar9._0_16_);
  aVar3.values[2] = (float)(int)uVar2;
  aVar3.values[3] = (float)(int)((ulong)uVar2 >> 0x20);
  aVar3.values[0] = (float)(int)uVar1;
  aVar3.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  return (array<float,_4>)(array<float,_4>)aVar3.values;
}

Assistant:

LookupLe(Point2f st, const SampledWavelengths &lambda) const {
        RGB rgb;
        for (int c = 0; c < 3; ++c)
            rgb[c] = image.LookupNearestChannel(st, c, wrapMode);
        return scale * RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);
    }